

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O1

void glob_audio_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  uint which;
  long lVar2;
  t_float tVar3;
  int aiStack_90 [5];
  t_audiosettings local_7c;
  
  local_7c.a_api = audio_nextsettings.a_api;
  aiStack_90[0] = 0x171d45;
  aiStack_90[1] = 0;
  tVar3 = atom_getfloatarg(0x10,argc,argv);
  local_7c.a_srate = (int)tVar3;
  aiStack_90[0] = 0x171d5c;
  aiStack_90[1] = 0;
  tVar3 = atom_getfloatarg(0x11,argc,argv);
  local_7c.a_advance = (int)tVar3;
  aiStack_90[0] = 0x171d73;
  aiStack_90[1] = 0;
  tVar3 = atom_getfloatarg(0x12,argc,argv);
  local_7c.a_callback = (int)tVar3;
  aiStack_90[0] = 0x171d8a;
  aiStack_90[1] = 0;
  tVar3 = atom_getfloatarg(0x13,argc,argv);
  local_7c.a_blocksize = (int)tVar3;
  lVar2 = 0;
  do {
    which = (uint)lVar2;
    aiStack_90[0] = 0x171da2;
    aiStack_90[1] = 0;
    tVar3 = atom_getfloatarg(which,argc,argv);
    local_7c.a_indevvec[lVar2] = (int)tVar3;
    aiStack_90[0] = 0x171dbb;
    aiStack_90[1] = 0;
    tVar3 = atom_getfloatarg(which | 4,argc,argv);
    local_7c.a_chindevvec[lVar2] = (int)tVar3;
    aiStack_90[0] = 0x171dd4;
    aiStack_90[1] = 0;
    tVar3 = atom_getfloatarg(which | 8,argc,argv);
    local_7c.a_outdevvec[lVar2] = (int)tVar3;
    aiStack_90[0] = 0x171ded;
    aiStack_90[1] = 0;
    tVar3 = atom_getfloatarg(which | 0xc,argc,argv);
    local_7c.a_choutdevvec[lVar2] = (int)tVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_7c.a_nindev = 0;
  lVar2 = 7;
  do {
    if (local_7c.a_indevvec[lVar2 + -2] != 0) {
      local_7c.a_indevvec[local_7c.a_nindev] = aiStack_90[lVar2];
      local_7c.a_chindevvec[local_7c.a_nindev] = local_7c.a_indevvec[lVar2 + -2];
      local_7c.a_nindev = local_7c.a_nindev + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  local_7c.a_noutdev = 0;
  lVar2 = 0x11;
  do {
    if (local_7c.a_indevvec[lVar2 + -2] != 0) {
      local_7c.a_outdevvec[local_7c.a_noutdev] = aiStack_90[lVar2];
      local_7c.a_choutdevvec[local_7c.a_noutdev] = local_7c.a_indevvec[lVar2 + -2];
      local_7c.a_noutdev = local_7c.a_noutdev + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x15);
  local_7c.a_nchindev = local_7c.a_nindev;
  local_7c.a_nchoutdev = local_7c.a_noutdev;
  iVar1 = 0;
  if (0 < local_7c.a_callback) {
    iVar1 = local_7c.a_callback;
  }
  aiStack_90[0] = 0x171e9d;
  aiStack_90[1] = 0;
  local_7c.a_callback = iVar1;
  iVar1 = ilog2(local_7c.a_blocksize);
  iVar1 = 1 << ((byte)iVar1 & 0x1f);
  local_7c.a_blocksize = 0x40;
  if (0xfffff83e < iVar1 - 0x801U) {
    local_7c.a_blocksize = iVar1;
  }
  if (local_7c.a_callback == 0 && audio_callback_is_open == 0) {
    aiStack_90[0] = 0x171ece;
    aiStack_90[1] = 0;
    sys_close_audio();
  }
  aiStack_90[0] = 0x171edb;
  aiStack_90[1] = 0;
  sys_set_audio_settings(&local_7c);
  if (local_7c.a_callback != 0 || audio_callback_is_open != 0) {
    sched_reopenmeplease();
    return;
  }
  sys_reopen_audio();
  return;
}

Assistant:

void glob_audio_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_audiosettings as;
    as.a_api = audio_nextsettings.a_api;
    as.a_srate = atom_getfloatarg(16, argc, argv);
    as.a_advance = atom_getfloatarg(17, argc, argv);
    as.a_callback = atom_getfloatarg(18, argc, argv);
    as.a_blocksize = atom_getfloatarg(19, argc, argv);

    for (i = 0; i < 4; i++)
    {
        as.a_indevvec[i] = atom_getfloatarg(i, argc, argv);
        as.a_chindevvec[i] = atom_getfloatarg(i+4, argc, argv);
        as.a_outdevvec[i] = atom_getfloatarg(i+8, argc, argv);
        as.a_choutdevvec[i] = atom_getfloatarg(i+12, argc, argv);
    }
        /* compact out any zeros and count nonzero entries */
    for (i = 0, as.a_nindev = 0; i < 4; i++)
    {
        if (as.a_chindevvec[i])
        {
            as.a_indevvec[as.a_nindev] = as.a_indevvec[i];
            as.a_chindevvec[as.a_nindev] = as.a_chindevvec[i];
            as.a_nindev++;
        }
    }
    for (i = 0, as.a_noutdev = 0; i < 4; i++)
    {
        if (as.a_choutdevvec[i])
        {
            as.a_outdevvec[as.a_noutdev] = as.a_outdevvec[i];
            as.a_choutdevvec[as.a_noutdev] = as.a_choutdevvec[i];
            as.a_noutdev++;
        }
    }
    as.a_nchindev = as.a_nindev;
    as.a_nchoutdev = as.a_noutdev;
    if (as.a_callback < 0)
        as.a_callback = 0;
    as.a_blocksize = (1<<ilog2(as.a_blocksize));
    if (as.a_blocksize < DEFDACBLKSIZE || as.a_blocksize > MAXBLOCKSIZE)
            as.a_blocksize = DEFDACBLKSIZE;

    if (!audio_callback_is_open && !as.a_callback)
        sys_close_audio();
    sys_set_audio_settings(&as);
    if (!audio_callback_is_open && !as.a_callback)
        sys_reopen_audio();
    else sched_reopenmeplease();
}